

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execute_between.cpp
# Opt level: O1

unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true> __thiscall
duckdb::ExpressionExecutor::InitializeState
          (ExpressionExecutor *this,BoundBetweenExpression *expr,ExpressionExecutorState *root)

{
  ExpressionState *this_00;
  pointer pEVar1;
  type pEVar2;
  pointer *__ptr;
  
  this_00 = (ExpressionState *)operator_new(0xb0);
  ExpressionState::ExpressionState(this_00,&expr->super_Expression,root);
  (this->expressions).
  super_vector<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
  super__Vector_base<const_duckdb::Expression_*,_std::allocator<const_duckdb::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
  pEVar1 = unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>::
           operator->((unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>
                       *)this);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (&expr->input);
  ExpressionState::AddChild(pEVar1,pEVar2);
  pEVar1 = unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>::
           operator->((unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>
                       *)this);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (&expr->lower);
  ExpressionState::AddChild(pEVar1,pEVar2);
  pEVar1 = unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>::
           operator->((unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>
                       *)this);
  pEVar2 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                     (&expr->upper);
  ExpressionState::AddChild(pEVar1,pEVar2);
  pEVar1 = unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>::
           operator->((unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>,_true>
                       *)this);
  ExpressionState::Finalize(pEVar1);
  return (unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>)
         (unique_ptr<duckdb::ExpressionState,_std::default_delete<duckdb::ExpressionState>_>)this;
}

Assistant:

unique_ptr<ExpressionState> ExpressionExecutor::InitializeState(const BoundBetweenExpression &expr,
                                                                ExpressionExecutorState &root) {
	auto result = make_uniq<ExpressionState>(expr, root);
	result->AddChild(*expr.input);
	result->AddChild(*expr.lower);
	result->AddChild(*expr.upper);

	result->Finalize();
	return result;
}